

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int tx_elements_input_issuance_init
              (wally_tx_input *input,uchar *nonce,size_t nonce_len,uchar *entropy,size_t entropy_len
              ,uchar *issuance_amount,size_t issuance_amount_len,uchar *inflation_keys,
              size_t inflation_keys_len,uchar *issuance_amount_rangeproof,
              size_t issuance_amount_rangeproof_len,uchar *inflation_keys_rangeproof,
              size_t inflation_keys_rangeproof_len,_Bool is_elements)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Bool _Var5;
  int iVar6;
  uchar *new_inflation_keys;
  uchar *new_issuance_amount;
  
  new_issuance_amount = (uchar *)0x0;
  new_inflation_keys = (uchar *)0x0;
  iVar6 = -2;
  if (((((input != (wally_tx_input *)0x0) && ((nonce != (uchar *)0x0) != (nonce_len != 0x20))) &&
       ((entropy != (uchar *)0x0) != (entropy_len != 0x20))) &&
      (((issuance_amount != (uchar *)0x0) != (issuance_amount_len == 0) &&
       ((inflation_keys != (uchar *)0x0) != (inflation_keys_len == 0))))) &&
     (((issuance_amount_rangeproof != (uchar *)0x0) != (issuance_amount_rangeproof_len == 0) &&
      ((inflation_keys_rangeproof != (uchar *)0x0) != (inflation_keys_rangeproof_len == 0))))) {
    _Var5 = clone_data(&new_issuance_amount,issuance_amount,issuance_amount_len);
    iVar6 = -3;
    if (((_Var5) &&
        (_Var5 = clone_data(&new_inflation_keys,inflation_keys,inflation_keys_len), _Var5)) &&
       (iVar6 = tx_elements_input_issuance_proof_init
                          (input,issuance_amount_rangeproof,issuance_amount_rangeproof_len,
                           inflation_keys_rangeproof,inflation_keys_rangeproof_len), iVar6 == 0)) {
      if (nonce == (uchar *)0x0) {
        wally_clear(input->blinding_nonce,0x20);
      }
      else {
        uVar2 = *(undefined8 *)nonce;
        uVar3 = *(undefined8 *)(nonce + 8);
        uVar4 = *(undefined8 *)(nonce + 0x18);
        *(undefined8 *)(input->blinding_nonce + 0x10) = *(undefined8 *)(nonce + 0x10);
        *(undefined8 *)(input->blinding_nonce + 0x18) = uVar4;
        *(undefined8 *)input->blinding_nonce = uVar2;
        *(undefined8 *)(input->blinding_nonce + 8) = uVar3;
      }
      if (entropy == (uchar *)0x0) {
        wally_clear(input->entropy,0x20);
      }
      else {
        uVar2 = *(undefined8 *)entropy;
        uVar3 = *(undefined8 *)(entropy + 8);
        uVar4 = *(undefined8 *)(entropy + 0x18);
        *(undefined8 *)(input->entropy + 0x10) = *(undefined8 *)(entropy + 0x10);
        *(undefined8 *)(input->entropy + 0x18) = uVar4;
        *(undefined8 *)input->entropy = uVar2;
        *(undefined8 *)(input->entropy + 8) = uVar3;
      }
      input->issuance_amount = new_issuance_amount;
      input->issuance_amount_len = issuance_amount_len;
      input->inflation_keys = new_inflation_keys;
      input->inflation_keys_len = inflation_keys_len;
      if (!is_elements) {
        return 0;
      }
      bVar1 = input->features;
      input->features = bVar1 | 1;
      if (nonce == (uchar *)0x0 && entropy == (uchar *)0x0) {
        return 0;
      }
      input->features = bVar1 | 3;
      return 0;
    }
    clear_and_free(new_issuance_amount,issuance_amount_len);
    clear_and_free(new_inflation_keys,inflation_keys_len);
  }
  return iVar6;
}

Assistant:

static int tx_elements_input_issuance_init(
    struct wally_tx_input *input,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *entropy,
    size_t entropy_len,
    const unsigned char *issuance_amount,
    size_t issuance_amount_len,
    const unsigned char *inflation_keys,
    size_t inflation_keys_len,
    const unsigned char *issuance_amount_rangeproof,
    size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof,
    size_t inflation_keys_rangeproof_len,
    bool is_elements)
{
#ifdef BUILD_ELEMENTS
    int ret;
    unsigned char *new_issuance_amount = NULL, *new_inflation_keys = NULL;
#endif

    if (!input ||
        BYTES_INVALID_N(nonce, nonce_len, WALLY_TX_ASSET_TAG_LEN) ||
        BYTES_INVALID_N(entropy, entropy_len, WALLY_TX_ASSET_TAG_LEN) ||
        BYTES_INVALID(issuance_amount, issuance_amount_len) ||
        BYTES_INVALID(inflation_keys, inflation_keys_len) ||
        BYTES_INVALID(issuance_amount_rangeproof, issuance_amount_rangeproof_len) ||
        BYTES_INVALID(inflation_keys_rangeproof, inflation_keys_rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_issuance_amount, issuance_amount, issuance_amount_len) ||
        !clone_bytes(&new_inflation_keys, inflation_keys, inflation_keys_len))
        ret = WALLY_ENOMEM;
    else
        ret = tx_elements_input_issuance_proof_init(input,
                                                    issuance_amount_rangeproof,
                                                    issuance_amount_rangeproof_len,
                                                    inflation_keys_rangeproof,
                                                    inflation_keys_rangeproof_len);

    if (ret != WALLY_OK) {
        clear_and_free(new_issuance_amount, issuance_amount_len);
        clear_and_free(new_inflation_keys, inflation_keys_len);
        return ret;
    }

    TX_COPY_ELSE_CLEAR(input->blinding_nonce, nonce, sizeof(input->blinding_nonce));
    TX_COPY_ELSE_CLEAR(input->entropy, entropy, sizeof(input->entropy));
    input->issuance_amount = new_issuance_amount;
    input->issuance_amount_len = issuance_amount_len;
    input->inflation_keys = new_inflation_keys;
    input->inflation_keys_len = inflation_keys_len;
#endif

    if (is_elements) {
        input->features |= WALLY_TX_IS_ELEMENTS;
        if (nonce || entropy)
            input->features |= WALLY_TX_IS_ISSUANCE;
    }

    return WALLY_OK;
}